

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

Am_Object __thiscall
Am_Connection::Get_Net_Instance(Am_Connection *this,char *proto_name,int instance_num)

{
  char *initial;
  Am_Value local_30;
  Am_Value_List local_20;
  
  this->data = (Am_Connection_Data *)0x0;
  initial = Net_ID_Str(proto_name,instance_num);
  Am_Value::Am_Value(&local_30,initial);
  Am_Value_List::Assoc_2(&local_20,(Am_Value *)&Net_Instances);
  Am_Object::operator=((Am_Object *)this,(Am_Value *)&local_20);
  Am_Value::~Am_Value((Am_Value *)&local_20);
  Am_Value::~Am_Value(&local_30);
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Connection::Get_Net_Instance(const char *proto_name, int instance_num)
{
  Am_Object obj;
  obj = Net_Instances.Assoc_2(Net_ID_Str(proto_name, instance_num));
  return obj;
}